

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Output.cxx
# Opt level: O0

void __thiscall Fl_Value_Output::draw(Fl_Value_Output *this)

{
  byte bVar1;
  Fl_Boxtype FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Fl_Color FVar11;
  Fl_Font face;
  Fl_Fontsize fsize;
  Fl_Color local_cc;
  Fl_Boxtype local_b4;
  char local_a8 [8];
  char buf [128];
  int H;
  int W;
  int Y;
  int X;
  Fl_Boxtype b;
  Fl_Value_Output *this_local;
  
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  if (FVar2 == FL_NO_BOX) {
    local_b4 = FL_DOWN_BOX;
  }
  else {
    local_b4 = Fl_Widget::box((Fl_Widget *)this);
  }
  iVar3 = Fl_Widget::x((Fl_Widget *)this);
  iVar4 = Fl::box_dx(local_b4);
  iVar5 = Fl_Widget::y((Fl_Widget *)this);
  iVar6 = Fl::box_dy(local_b4);
  iVar7 = Fl_Widget::w((Fl_Widget *)this);
  iVar8 = Fl::box_dw(local_b4);
  iVar9 = Fl_Widget::h((Fl_Widget *)this);
  iVar10 = Fl::box_dh(local_b4);
  buf._124_4_ = iVar9 - iVar10;
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar1 & 0xfe) == 0) {
    FVar11 = Fl_Widget::color((Fl_Widget *)this);
    fl_color(FVar11);
    fl_rectf(iVar3 + iVar4,iVar5 + iVar6,iVar7 - iVar8,buf._124_4_);
  }
  else {
    FVar11 = Fl_Widget::color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,local_b4,FVar11);
  }
  (*(this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,local_a8);
  iVar9 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar9 == 0) {
    FVar11 = textcolor(this);
    local_cc = fl_inactive(FVar11);
  }
  else {
    local_cc = textcolor(this);
  }
  fl_color(local_cc);
  face = textfont(this);
  fsize = textsize(this);
  fl_font(face,fsize);
  fl_draw(local_a8,iVar3 + iVar4,iVar5 + iVar6,iVar7 - iVar8,buf._124_4_,4,(Fl_Image *)0x0,1);
  return;
}

Assistant:

void Fl_Value_Output::draw() {
  Fl_Boxtype b = box() ? box() : FL_DOWN_BOX;
  int X = x()+Fl::box_dx(b);
  int Y = y()+Fl::box_dy(b);
  int W = w()-Fl::box_dw(b);
  int H = h()-Fl::box_dh(b);
  if (damage()&~FL_DAMAGE_CHILD)
    draw_box(b, color());
  else {
    fl_color(color());
    fl_rectf(X, Y, W, H);
  }
  char buf[128];
  format(buf);
  fl_color(active_r() ? textcolor() : fl_inactive(textcolor()));
  fl_font(textfont(), textsize());
  fl_draw(buf,X,Y,W,H,FL_ALIGN_LEFT);
}